

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BlobCompare(Mem *pB1,Mem *pB2)

{
  int iVar1;
  int iVar2;
  int *in_RSI;
  int *in_RDI;
  int n2;
  int n1;
  int c;
  int local_3c;
  int local_4;
  
  iVar1 = in_RDI[3];
  iVar2 = in_RSI[3];
  if (((*(ushort *)(in_RDI + 2) | *(ushort *)(in_RSI + 2)) & 0x4000) == 0) {
    local_3c = iVar1;
    if (iVar2 < iVar1) {
      local_3c = iVar2;
    }
    local_4 = memcmp(*(void **)(in_RDI + 4),*(void **)(in_RSI + 4),(long)local_3c);
    if (local_4 == 0) {
      local_4 = iVar1 - iVar2;
    }
  }
  else if ((*(ushort *)(in_RDI + 2) & *(ushort *)(in_RSI + 2) & 0x4000) == 0) {
    if ((*(ushort *)(in_RDI + 2) & 0x4000) == 0) {
      iVar2 = isAllZero(*(char **)(in_RDI + 4),in_RDI[3]);
      if (iVar2 == 0) {
        local_4 = 1;
      }
      else {
        local_4 = iVar1 - *in_RSI;
      }
    }
    else {
      iVar1 = isAllZero(*(char **)(in_RSI + 4),in_RSI[3]);
      if (iVar1 == 0) {
        local_4 = -1;
      }
      else {
        local_4 = *in_RDI - iVar2;
      }
    }
  }
  else {
    local_4 = *in_RDI - *in_RSI;
  }
  return local_4;
}

Assistant:

int sqlite3BlobCompare(const Mem *pB1, const Mem *pB2){
  int c;
  int n1 = pB1->n;
  int n2 = pB2->n;

  /* It is possible to have a Blob value that has some non-zero content
  ** followed by zero content.  But that only comes up for Blobs formed
  ** by the OP_MakeRecord opcode, and such Blobs never get passed into
  ** sqlite3MemCompare(). */
  assert( (pB1->flags & MEM_Zero)==0 || n1==0 );
  assert( (pB2->flags & MEM_Zero)==0 || n2==0 );

  if( (pB1->flags|pB2->flags) & MEM_Zero ){
    if( pB1->flags & pB2->flags & MEM_Zero ){
      return pB1->u.nZero - pB2->u.nZero;
    }else if( pB1->flags & MEM_Zero ){
      if( !isAllZero(pB2->z, pB2->n) ) return -1;
      return pB1->u.nZero - n2;
    }else{
      if( !isAllZero(pB1->z, pB1->n) ) return +1;
      return n1 - pB2->u.nZero;
    }
  }
  c = memcmp(pB1->z, pB2->z, n1>n2 ? n2 : n1);
  if( c ) return c;
  return n1 - n2;
}